

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestRegistry::getFilteredTests
          (TestRegistry *this,TestSpec *testSpec,IConfig *config,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases)

{
  bool bVar1;
  uint uVar2;
  reference pTVar3;
  pointer this_00;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_38;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases_local;
  IConfig *config_local;
  TestSpec *testSpec_local;
  TestRegistry *this_local;
  
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                    (&this->m_functionsInOrder);
  local_38._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                 (&this->m_functionsInOrder);
  do {
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_38);
    if (!bVar1) {
      return;
    }
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&itEnd);
    bVar1 = TestSpec::matches(testSpec,&pTVar3->super_TestCaseInfo);
    if (bVar1) {
      uVar2 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
      if ((uVar2 & 1) == 0) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  ::operator->(&itEnd);
        bVar1 = TestCaseInfo::throws(&this_00->super_TestCaseInfo);
        if (bVar1) goto LAB_001eb824;
      }
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&itEnd);
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (matchingTestCases,pTVar3);
    }
LAB_001eb824:
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  } while( true );
}

Assistant:

virtual void getFilteredTests( TestSpec const& testSpec, IConfig const& config, std::vector<TestCase>& matchingTestCases ) const {
            for( std::vector<TestCase>::const_iterator  it = m_functionsInOrder.begin(),
                                                        itEnd = m_functionsInOrder.end();
                    it != itEnd;
                    ++it ) {
                if( testSpec.matches( *it ) && ( config.allowThrows() || !it->throws() ) )
                    matchingTestCases.push_back( *it );
            }
        }